

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapBase.h
# Opt level: O0

void __thiscall
Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>,_0>::
MapBase(MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>,_0>
        *this,PointerType dataPtr,Index vecSize)

{
  Index vecSize_local;
  PointerType dataPtr_local;
  MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>,_0>
  *this_local;
  
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>::
  MatrixBase((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>
              *)this);
  this->m_data = dataPtr;
  internal::variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_rows,vecSize);
  internal::variable_if_dynamic<long,_1>::variable_if_dynamic
            ((variable_if_dynamic<long,_1> *)&this->field_0x10,1);
  if (-1 < vecSize) {
    checkSanity(this);
    return;
  }
  __assert_fail("vecSize >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/MapBase.h"
                ,0x8a,
                "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>, 1>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>, 1>, Level = 0]"
               );
}

Assistant:

inline MapBase(PointerType dataPtr, Index vecSize)
            : m_data(dataPtr),
              m_rows(RowsAtCompileTime == Dynamic ? vecSize : Index(RowsAtCompileTime)),
              m_cols(ColsAtCompileTime == Dynamic ? vecSize : Index(ColsAtCompileTime))
    {
      EIGEN_STATIC_ASSERT_VECTOR_ONLY(Derived)
      eigen_assert(vecSize >= 0);
      eigen_assert(dataPtr == 0 || SizeAtCompileTime == Dynamic || SizeAtCompileTime == vecSize);
      checkSanity();
    }